

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void ponger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  long lVar2;
  uv_write_t *req;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  code *loop;
  long *plVar5;
  undefined1 *puVar6;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  undefined1 auStack_12c0 [16];
  uv_loop_t *puStack_12b0;
  uv_connect_t uStack_12a8;
  uv_pipe_t uStack_1240;
  long alStack_1158 [64];
  uv_loop_t *puStack_f58;
  long lStack_f48;
  long lStack_f40;
  undefined1 auStack_f38 [264];
  uv_pipe_t uStack_e30;
  uv_loop_t auStack_d48 [2];
  undefined1 uStack_549;
  uv_loop_t *puStack_548;
  long lStack_538;
  long lStack_530;
  uv_pipe_t uStack_528;
  uv_loop_t *puStack_440;
  long lStack_430;
  long lStack_428;
  uv_pipe_t uStack_420;
  uv_loop_t *puStack_338;
  long lStack_328;
  long lStack_320;
  uv_pipe_t uStack_318;
  uv_loop_t *puStack_230;
  code *pcStack_228;
  long lStack_220;
  long lStack_218;
  uv_pipe_t uStack_210;
  uv_pipe_t uStack_128;
  uv_stream_t *puStack_40;
  long local_30;
  undefined8 local_28;
  uv_buf_t local_20;
  
  if (nread < 0) {
    local_20.len = (size_t)local_20.base;
    local_20.base = (char *)nread;
    local_30 = -0xfff;
    if (nread == -0xfff) {
      puStack_40 = (uv_stream_t *)0x1ac5d7;
      puts("got EOF");
      puStack_40 = (uv_stream_t *)0x1ac5df;
      free(buf->base);
      uv_close((uv_handle_t *)stream,ponger_on_close);
      return;
    }
  }
  else {
    if (nread != 0) {
      lVar2 = 0;
      do {
        if (buf->base[lVar2] == 'I') {
          buf->base[lVar2] = 'O';
        }
        lVar2 = lVar2 + 1;
      } while (nread != lVar2);
    }
    puStack_40 = (uv_stream_t *)0x1ac54e;
    local_20 = uv_buf_init(buf->base,nread);
    puStack_40 = (uv_stream_t *)0x1ac562;
    req = (uv_write_t *)malloc(200);
    if (req == (uv_write_t *)0x0) {
      puStack_40 = (uv_stream_t *)0x1ac5fa;
      ponger_read_cb_cold_2();
    }
    else {
      req->data = buf->base;
      puStack_40 = (uv_stream_t *)0x1ac58d;
      iVar1 = uv_write(req,stream,&local_20,1,pinger_after_write);
      local_30 = (long)iVar1;
      local_28 = 0;
      if (local_30 == 0) {
        return;
      }
    }
    puStack_40 = (uv_stream_t *)0x1ac609;
    ponger_read_cb_cold_1();
  }
  puStack_40 = (uv_stream_t *)run_test_pipe_bind_error_addrinuse;
  ponger_read_cb_cold_3();
  plVar5 = &lStack_220;
  pcStack_228 = (code *)0x1ac625;
  puStack_40 = stream;
  puVar3 = uv_default_loop();
  pcStack_228 = (code *)0x1ac637;
  iVar1 = uv_pipe_init(puVar3,&uStack_128,0);
  uStack_210.data = (void *)(long)iVar1;
  lStack_220 = 0;
  if (uStack_210.data == (void *)0x0) {
    pcStack_228 = (code *)0x1ac669;
    iVar1 = uv_pipe_bind(&uStack_128,"/tmp/uv-test-sock");
    uStack_210.data = (void *)(long)iVar1;
    lStack_220 = 0;
    if (uStack_210.data != (void *)0x0) goto LAB_001ac806;
    pcStack_228 = (code *)0x1ac68c;
    puVar3 = uv_default_loop();
    pcStack_228 = (code *)0x1ac69b;
    iVar1 = uv_pipe_init(puVar3,&uStack_210,0);
    lStack_220 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_220 != 0) goto LAB_001ac813;
    pcStack_228 = (code *)0x1ac6ca;
    iVar1 = uv_pipe_bind(&uStack_210,"/tmp/uv-test-sock");
    lStack_220 = (long)iVar1;
    lStack_218 = -0x62;
    if (lStack_220 != -0x62) goto LAB_001ac820;
    pcStack_228 = (code *)0x1ac6fc;
    iVar1 = uv_listen((uv_stream_t *)&uStack_128,0x1000,(uv_connection_cb)0x0);
    lStack_220 = (long)iVar1;
    lStack_218 = 0;
    if (lStack_220 != 0) goto LAB_001ac82d;
    pcStack_228 = (code *)0x1ac72b;
    iVar1 = uv_listen((uv_stream_t *)&uStack_210,0x1000,(uv_connection_cb)0x0);
    lStack_220 = (long)iVar1;
    lStack_218 = -0x16;
    if (lStack_220 != -0x16) goto LAB_001ac83a;
    loop = close_cb;
    pcStack_228 = (code *)0x1ac760;
    uv_close((uv_handle_t *)&uStack_128,close_cb);
    pcStack_228 = (code *)0x1ac76d;
    uv_close((uv_handle_t *)&uStack_210,close_cb);
    pcStack_228 = (code *)0x1ac772;
    puVar3 = uv_default_loop();
    pcStack_228 = (code *)0x1ac77c;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_220 = 2;
    lStack_218 = (long)close_cb_called;
    if (lStack_218 != 2) goto LAB_001ac847;
    pcStack_228 = (code *)0x1ac7a4;
    loop = (code *)uv_default_loop();
    pcStack_228 = (code *)0x1ac7b8;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    pcStack_228 = (code *)0x1ac7c2;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    lStack_220 = 0;
    pcStack_228 = (code *)0x1ac7cf;
    puVar3 = uv_default_loop();
    pcStack_228 = (code *)0x1ac7d7;
    iVar1 = uv_loop_close(puVar3);
    lStack_218 = (long)iVar1;
    if (lStack_220 == lStack_218) {
      pcStack_228 = (code *)0x1ac7ee;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_228 = (code *)0x1ac806;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_001ac806:
    pcStack_228 = (code *)0x1ac813;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_001ac813:
    pcStack_228 = (code *)0x1ac820;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_001ac820:
    pcStack_228 = (code *)0x1ac82d;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_001ac82d:
    pcStack_228 = (code *)0x1ac83a;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_001ac83a:
    pcStack_228 = (code *)0x1ac847;
    run_test_pipe_bind_error_addrinuse_cold_6();
    loop = (code *)stream;
LAB_001ac847:
    pcStack_228 = (code *)0x1ac854;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  pcStack_228 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (plVar5 != (long *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  puStack_230 = (uv_loop_t *)run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  puStack_338 = (uv_loop_t *)0x1ac880;
  puStack_230 = (uv_loop_t *)loop;
  puVar3 = uv_default_loop();
  puStack_338 = (uv_loop_t *)0x1ac88f;
  iVar1 = uv_pipe_init(puVar3,&uStack_318,0);
  lStack_320 = (long)iVar1;
  lStack_328 = 0;
  if (lStack_320 == 0) {
    puStack_338 = (uv_loop_t *)0x1ac8c0;
    iVar1 = uv_pipe_bind(&uStack_318,"/path/to/unix/socket/that/really/should/not/be/there");
    lStack_320 = (long)iVar1;
    lStack_328 = -0xd;
    if (lStack_320 != -0xd) goto LAB_001ac98c;
    puStack_338 = (uv_loop_t *)0x1ac8f1;
    uv_close((uv_handle_t *)&uStack_318,close_cb);
    puStack_338 = (uv_loop_t *)0x1ac8f6;
    puVar3 = uv_default_loop();
    puStack_338 = (uv_loop_t *)0x1ac900;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_320 = 1;
    lStack_328 = (long)close_cb_called;
    if (lStack_328 != 1) goto LAB_001ac99b;
    puStack_338 = (uv_loop_t *)0x1ac926;
    loop = (code *)uv_default_loop();
    puStack_338 = (uv_loop_t *)0x1ac93a;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_338 = (uv_loop_t *)0x1ac944;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    lStack_320 = 0;
    puStack_338 = (uv_loop_t *)0x1ac952;
    puVar3 = uv_default_loop();
    puStack_338 = (uv_loop_t *)0x1ac95a;
    iVar1 = uv_loop_close(puVar3);
    lStack_328 = (long)iVar1;
    if (lStack_320 == lStack_328) {
      puStack_338 = (uv_loop_t *)0x1ac972;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_338 = (uv_loop_t *)0x1ac98c;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_001ac98c:
    puStack_338 = (uv_loop_t *)0x1ac99b;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_001ac99b:
    puStack_338 = (uv_loop_t *)0x1ac9aa;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_338 = (uv_loop_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  puStack_440 = (uv_loop_t *)0x1ac9c6;
  puStack_338 = (uv_loop_t *)loop;
  puVar3 = uv_default_loop();
  puStack_440 = (uv_loop_t *)0x1ac9d5;
  iVar1 = uv_pipe_init(puVar3,&uStack_420,0);
  lStack_428 = (long)iVar1;
  lStack_430 = 0;
  if (lStack_428 == 0) {
    puStack_440 = (uv_loop_t *)0x1aca06;
    iVar1 = uv_pipe_bind(&uStack_420,"/tmp/uv-test-sock");
    lStack_428 = (long)iVar1;
    lStack_430 = 0;
    if (lStack_428 != 0) goto LAB_001acb07;
    puStack_440 = (uv_loop_t *)0x1aca37;
    iVar1 = uv_pipe_bind(&uStack_420,"/tmp/uv-test-sock2");
    lStack_428 = (long)iVar1;
    lStack_430 = -0x16;
    if (lStack_428 != -0x16) goto LAB_001acb16;
    puStack_440 = (uv_loop_t *)0x1aca68;
    uv_close((uv_handle_t *)&uStack_420,close_cb);
    puStack_440 = (uv_loop_t *)0x1aca6d;
    puVar3 = uv_default_loop();
    puStack_440 = (uv_loop_t *)0x1aca77;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_428 = 1;
    lStack_430 = (long)close_cb_called;
    if (lStack_430 != 1) goto LAB_001acb25;
    puStack_440 = (uv_loop_t *)0x1acaa1;
    loop = (code *)uv_default_loop();
    puStack_440 = (uv_loop_t *)0x1acab5;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_440 = (uv_loop_t *)0x1acabf;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    lStack_428 = 0;
    puStack_440 = (uv_loop_t *)0x1acacd;
    puVar3 = uv_default_loop();
    puStack_440 = (uv_loop_t *)0x1acad5;
    iVar1 = uv_loop_close(puVar3);
    lStack_430 = (long)iVar1;
    if (lStack_428 == lStack_430) {
      puStack_440 = (uv_loop_t *)0x1acaed;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_440 = (uv_loop_t *)0x1acb07;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001acb07:
    puStack_440 = (uv_loop_t *)0x1acb16;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001acb16:
    puStack_440 = (uv_loop_t *)0x1acb25;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001acb25:
    puStack_440 = (uv_loop_t *)0x1acb34;
    run_test_pipe_bind_error_inval_cold_4();
  }
  puStack_440 = (uv_loop_t *)run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  puStack_548 = (uv_loop_t *)0x1acb50;
  puStack_440 = (uv_loop_t *)loop;
  puVar3 = uv_default_loop();
  puStack_548 = (uv_loop_t *)0x1acb5f;
  iVar1 = uv_pipe_init(puVar3,&uStack_528,0);
  lStack_530 = (long)iVar1;
  lStack_538 = 0;
  if (lStack_530 == 0) {
    puStack_548 = (uv_loop_t *)0x1acb90;
    iVar1 = uv_listen((uv_stream_t *)&uStack_528,0x1000,(uv_connection_cb)0x0);
    lStack_530 = (long)iVar1;
    lStack_538 = -0x16;
    if (lStack_530 != -0x16) goto LAB_001acc5c;
    puStack_548 = (uv_loop_t *)0x1acbc1;
    uv_close((uv_handle_t *)&uStack_528,close_cb);
    puStack_548 = (uv_loop_t *)0x1acbc6;
    puVar3 = uv_default_loop();
    puStack_548 = (uv_loop_t *)0x1acbd0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_530 = 1;
    lStack_538 = (long)close_cb_called;
    if (lStack_538 != 1) goto LAB_001acc6b;
    puStack_548 = (uv_loop_t *)0x1acbf6;
    loop = (code *)uv_default_loop();
    puStack_548 = (uv_loop_t *)0x1acc0a;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_548 = (uv_loop_t *)0x1acc14;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    lStack_530 = 0;
    puStack_548 = (uv_loop_t *)0x1acc22;
    puVar3 = uv_default_loop();
    puStack_548 = (uv_loop_t *)0x1acc2a;
    iVar1 = uv_loop_close(puVar3);
    lStack_538 = (long)iVar1;
    if (lStack_530 == lStack_538) {
      puStack_548 = (uv_loop_t *)0x1acc42;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_548 = (uv_loop_t *)0x1acc5c;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001acc5c:
    puStack_548 = (uv_loop_t *)0x1acc6b;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001acc6b:
    puStack_548 = (uv_loop_t *)0x1acc7a;
    run_test_pipe_listen_without_bind_cold_3();
  }
  puStack_548 = (uv_loop_t *)run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  puVar3 = auStack_d48;
  auStack_f38._232_8_ = (uv_close_cb)0x1accab;
  puStack_548 = (uv_loop_t *)loop;
  memset(puVar3,0x2e,0x7ff);
  uStack_549 = 0;
  auStack_f38._232_8_ = (uv_close_cb)0x1accb7;
  puVar4 = uv_default_loop();
  auStack_f38._232_8_ = (uv_close_cb)0x1accc6;
  iVar1 = uv_pipe_init(puVar4,(uv_pipe_t *)(auStack_f38 + 0x108),0);
  if (iVar1 == 0) {
    auStack_f38._232_8_ = (uv_close_cb)0x1acce0;
    iVar1 = uv_pipe_bind((uv_pipe_t *)(auStack_f38 + 0x108),(char *)auStack_d48);
    if (iVar1 != -0x24) goto LAB_001acd73;
    auStack_f38._232_8_ = (uv_close_cb)0x1accfa;
    uv_close((uv_handle_t *)(auStack_f38 + 0x108),close_cb);
    auStack_f38._232_8_ = (uv_close_cb)0x1accff;
    puVar4 = uv_default_loop();
    auStack_f38._232_8_ = (uv_close_cb)0x1acd09;
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_001acd78;
    auStack_f38._232_8_ = (uv_close_cb)0x1acd17;
    puVar3 = uv_default_loop();
    auStack_f38._232_8_ = (uv_close_cb)0x1acd2b;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    auStack_f38._232_8_ = (uv_close_cb)0x1acd35;
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_f38._256_8_ = (uv_handle_t *)0x0;
    auStack_f38._232_8_ = (uv_close_cb)0x1acd43;
    puVar4 = uv_default_loop();
    auStack_f38._232_8_ = (uv_close_cb)0x1acd4b;
    iVar1 = uv_loop_close(puVar4);
    auStack_f38._248_8_ = SEXT48(iVar1);
    if (auStack_f38._256_8_ == auStack_f38._248_8_) {
      auStack_f38._232_8_ = (uv_close_cb)0x1acd63;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_f38._232_8_ = (uv_close_cb)0x1acd73;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001acd73:
    auStack_f38._232_8_ = (uv_close_cb)0x1acd78;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001acd78:
    auStack_f38._232_8_ = (uv_close_cb)0x1acd7d;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  auStack_f38._232_8_ = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  puStack_f58 = (uv_loop_t *)0x1acd99;
  auStack_f38._232_8_ = puVar3;
  puVar4 = uv_default_loop();
  puStack_f58 = (uv_loop_t *)0x1acda8;
  iVar1 = uv_pipe_init(puVar4,(uv_pipe_t *)auStack_f38,0);
  lStack_f40 = (long)iVar1;
  lStack_f48 = 0;
  if (lStack_f40 == 0) {
    puVar3 = (uv_loop_t *)auStack_f38;
    puStack_f58 = (uv_loop_t *)0x1acdd7;
    uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
    puStack_f58 = (uv_loop_t *)0x1acde6;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar3,"/tmp/uv-test-sock");
    lStack_f40 = (long)iVar1;
    lStack_f48 = -0x16;
    if (lStack_f40 != -0x16) goto LAB_001aced1;
    puStack_f58 = (uv_loop_t *)0x1ace17;
    iVar1 = uv_listen((uv_stream_t *)auStack_f38,0x1000,(uv_connection_cb)0x0);
    lStack_f40 = (long)iVar1;
    lStack_f48 = -0x16;
    if (lStack_f40 != -0x16) goto LAB_001acee0;
    puStack_f58 = (uv_loop_t *)0x1ace3c;
    puVar4 = uv_default_loop();
    puStack_f58 = (uv_loop_t *)0x1ace46;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    lStack_f40 = (long)iVar1;
    lStack_f48 = 0;
    if (lStack_f40 != 0) goto LAB_001aceef;
    puStack_f58 = (uv_loop_t *)0x1ace6b;
    puVar3 = uv_default_loop();
    puStack_f58 = (uv_loop_t *)0x1ace7f;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_f58 = (uv_loop_t *)0x1ace89;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_f40 = 0;
    puStack_f58 = (uv_loop_t *)0x1ace97;
    puVar4 = uv_default_loop();
    puStack_f58 = (uv_loop_t *)0x1ace9f;
    iVar1 = uv_loop_close(puVar4);
    lStack_f48 = (long)iVar1;
    if (lStack_f40 == lStack_f48) {
      puStack_f58 = (uv_loop_t *)0x1aceb7;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_f58 = (uv_loop_t *)0x1aced1;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001aced1:
    puStack_f58 = (uv_loop_t *)0x1acee0;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001acee0:
    puStack_f58 = (uv_loop_t *)0x1aceef;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001aceef:
    puStack_f58 = (uv_loop_t *)0x1acefe;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  puStack_f58 = (uv_loop_t *)run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  puVar6 = auStack_12c0 + 8;
  auStack_12c0._0_8_ = (void *)0x1acf1a;
  puStack_f58 = puVar3;
  puVar3 = uv_default_loop();
  auStack_12c0._0_8_ = (void *)0x1acf29;
  iVar1 = uv_pipe_init(puVar3,&uStack_1240,0);
  alStack_1158[0] = (long)iVar1;
  uStack_12a8.data = (uv_loop_t *)0x0;
  if (alStack_1158[0] == 0) {
    auStack_12c0._0_8_ = (void *)0x1acf69;
    memset(alStack_1158,0x40,0x200);
    uStack_12a8.data = (uv_loop_t *)0xffffffffffffffdc;
    auStack_12c0._0_8_ = (void *)0x1acf89;
    iVar1 = uv_pipe_bind2(&uStack_1240,(char *)alStack_1158,0x200,1);
    auStack_12c0._8_8_ = SEXT48(iVar1);
    if (uStack_12a8.data != (void *)auStack_12c0._8_8_) goto LAB_001ad13d;
    auStack_12c0._8_8_ = (uv_loop_t *)0xffffffffffffffdc;
    auStack_12c0._0_8_ = (void *)0x1acfcf;
    iVar1 = uv_pipe_connect2(&uStack_12a8,&uStack_1240,(char *)alStack_1158,0x200,1,abort);
    puStack_12b0 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_12c0._8_8_ != puStack_12b0) goto LAB_001ad14a;
    auStack_12c0._0_8_ = (void *)0x1acfea;
    puVar3 = uv_default_loop();
    auStack_12c0._0_8_ = (void *)0x1acff4;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_12c0._8_8_ = SEXT48(iVar1);
    puStack_12b0 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_12c0._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad157;
    auStack_12c0._8_8_ = (uv_loop_t *)0xffffffffffffffea;
    auStack_12c0._0_8_ = (void *)0x1ad02b;
    iVar1 = uv_pipe_bind(&uStack_1240,"");
    puStack_12b0 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_12c0._8_8_ != puStack_12b0) goto LAB_001ad164;
    auStack_12c0._0_8_ = (void *)0x1ad05e;
    uv_pipe_connect(&uStack_12a8,&uStack_1240,"",connect_overlong_cb);
    auStack_12c0._0_8_ = (void *)0x1ad063;
    puVar3 = uv_default_loop();
    auStack_12c0._0_8_ = (void *)0x1ad06d;
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_12c0._8_8_ = SEXT48(iVar1);
    puStack_12b0 = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_12c0._8_8_ != (uv_loop_t *)0x0) goto LAB_001ad171;
    auStack_12c0._8_8_ = (uv_loop_t *)0x1;
    puStack_12b0 = (uv_loop_t *)(long)connect_cb_called;
    if (puStack_12b0 != (uv_loop_t *)0x1) goto LAB_001ad17e;
    auStack_12c0._8_8_ = (uv_loop_t *)0x1;
    puStack_12b0 = (uv_loop_t *)(long)close_cb_called;
    if (puStack_12b0 == (uv_loop_t *)0x1) {
      auStack_12c0._0_8_ = (void *)0x1ad0d6;
      puVar3 = uv_default_loop();
      auStack_12c0._0_8_ = (void *)0x1ad0ea;
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      auStack_12c0._0_8_ = (void *)0x1ad0f4;
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_12c0._8_8_ = (uv_loop_t *)0x0;
      auStack_12c0._0_8_ = (void *)0x1ad101;
      puVar3 = uv_default_loop();
      auStack_12c0._0_8_ = (void *)0x1ad109;
      iVar1 = uv_loop_close(puVar3);
      puStack_12b0 = (uv_loop_t *)(long)iVar1;
      if ((uv_loop_t *)auStack_12c0._8_8_ == puStack_12b0) {
        auStack_12c0._0_8_ = (void *)0x1ad120;
        uv_library_shutdown();
        return;
      }
      goto LAB_001ad198;
    }
  }
  else {
    auStack_12c0._0_8_ = (void *)0x1ad13d;
    run_test_pipe_overlong_path_cold_1();
LAB_001ad13d:
    auStack_12c0._0_8_ = (void *)0x1ad14a;
    run_test_pipe_overlong_path_cold_2();
LAB_001ad14a:
    auStack_12c0._0_8_ = (void *)0x1ad157;
    run_test_pipe_overlong_path_cold_3();
LAB_001ad157:
    auStack_12c0._0_8_ = (void *)0x1ad164;
    run_test_pipe_overlong_path_cold_4();
LAB_001ad164:
    auStack_12c0._0_8_ = (void *)0x1ad171;
    run_test_pipe_overlong_path_cold_5();
LAB_001ad171:
    auStack_12c0._0_8_ = (void *)0x1ad17e;
    run_test_pipe_overlong_path_cold_6();
LAB_001ad17e:
    auStack_12c0._0_8_ = (void *)0x1ad18b;
    run_test_pipe_overlong_path_cold_7();
  }
  auStack_12c0._0_8_ = (void *)0x1ad198;
  run_test_pipe_overlong_path_cold_8();
LAB_001ad198:
  iVar1 = (int)&puStack_12b0;
  auStack_12c0._0_8_ = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  auStack_12c0._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_12c0._0_8_ == (void *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    uv_close(*(uv_handle_t **)(puVar6 + 0x50),close_cb);
    return;
  }
  handle = (uv_handle_t *)auStack_12c0;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void ponger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  uv_buf_t writebuf;
  uv_write_t* req;
  int i;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, ponger_on_close);

    return;
  }

  /* Echo back */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'I')
      buf->base[i] = 'O';
  }

  writebuf = uv_buf_init(buf->base, nread);
  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  req->data = buf->base;
  ASSERT_OK(uv_write(req, stream, &writebuf, 1, pinger_after_write));
}